

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_handle_eXIf(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  byte *pbVar1;
  int iVar2;
  undefined8 in_RAX;
  png_bytep ppVar3;
  char *error_message;
  ulong uVar4;
  undefined8 uStack_38;
  png_byte buf [1];
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if (length < 2) {
    png_crc_finish(png_ptr,length);
    error_message = "too short";
  }
  else if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x10000) != 0)) {
    png_crc_finish(png_ptr,length);
    error_message = "duplicate";
  }
  else {
    pbVar1 = (byte *)((long)&info_ptr->free_me + 1);
    *pbVar1 = *pbVar1 | 0x80;
    uStack_38 = in_RAX;
    ppVar3 = (png_bytep)png_malloc_warn(png_ptr,(ulong)length);
    info_ptr->eXIf_buf = ppVar3;
    if (ppVar3 != (png_bytep)0x0) {
      uVar4 = 0;
      do {
        if (length == uVar4) {
          iVar2 = png_crc_finish(png_ptr,0);
          if (iVar2 == 0) {
            png_set_eXIf_1(png_ptr,info_ptr,length,info_ptr->eXIf_buf);
LAB_00117ffe:
            png_free(png_ptr,info_ptr->eXIf_buf);
            info_ptr->eXIf_buf = (png_bytep)0x0;
          }
          return;
        }
        png_crc_read(png_ptr,buf,1);
        info_ptr->eXIf_buf[uVar4] = buf[0];
        if (((buf[0] & 0xfb) != 0x49 && uVar4 == 1) && (*info_ptr->eXIf_buf != buf[0])) {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error(png_ptr,"incorrect byte-order specifier");
          goto LAB_00117ffe;
        }
        uVar4 = uVar4 + 1;
      } while( true );
    }
    png_crc_finish(png_ptr,length);
    error_message = "out of memory";
  }
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_eXIf(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   unsigned int i;

   png_debug(1, "in png_handle_eXIf");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   if (length < 2)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "too short");
      return;
   }

   else if (info_ptr == NULL || (info_ptr->valid & PNG_INFO_eXIf) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   info_ptr->free_me |= PNG_FREE_EXIF;

   info_ptr->eXIf_buf = png_voidcast(png_bytep,
             png_malloc_warn(png_ptr, length));

   if (info_ptr->eXIf_buf == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   for (i = 0; i < length; i++)
   {
      png_byte buf[1];
      png_crc_read(png_ptr, buf, 1);
      info_ptr->eXIf_buf[i] = buf[0];
      if (i == 1 && buf[0] != 'M' && buf[0] != 'I'
                 && info_ptr->eXIf_buf[0] != buf[0])
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "incorrect byte-order specifier");
         png_free(png_ptr, info_ptr->eXIf_buf);
         info_ptr->eXIf_buf = NULL;
         return;
      }
   }

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   png_set_eXIf_1(png_ptr, info_ptr, length, info_ptr->eXIf_buf);

   png_free(png_ptr, info_ptr->eXIf_buf);
   info_ptr->eXIf_buf = NULL;
}